

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Flow * __thiscall
wasm::Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow>::visit
          (Flow *__return_storage_ptr__,
          Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow> *this,Expression *curr)

{
  size_t sVar1;
  char *pcVar2;
  
  pcVar2 = DAT_010d2618;
  sVar1 = NONCONSTANT_FLOW;
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBlock
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Block *)curr);
      break;
    case IfId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitIf
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(If *)curr);
      break;
    case LoopId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitLoop
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Loop *)curr);
      break;
    case BreakId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBreak
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Break *)curr);
      break;
    case SwitchId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSwitch
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Switch *)curr);
      break;
    case CallId:
    case CallIndirectId:
    case LoadId:
    case StoreId:
    case MemorySizeId:
    case MemoryGrowId:
    case AtomicRMWId:
    case AtomicCmpxchgId:
    case AtomicWaitId:
    case AtomicNotifyId:
    case SIMDLoadId:
    case SIMDLoadStoreLaneId:
    case MemoryInitId:
    case DataDropId:
    case MemoryCopyId:
    case MemoryFillId:
    case PopId:
    case TableGetId:
    case TableSetId:
    case TableSizeId:
    case TableGrowId:
    case TableFillId:
    case TableCopyId:
    case TableInitId:
    case TryId:
    case TryTableId:
    case RethrowId:
    case CallRefId:
    case StructSetId:
    case ArrayNewDataId:
    case ArrayNewElemId:
    case ArraySetId:
    case ArrayCopyId:
    case ArrayFillId:
    case ArrayInitDataId:
    case ArrayInitElemId:
    case StringEncodeId:
    case ContNewId:
    case ContBindId:
    case SuspendId:
    case ResumeId:
    case ResumeThrowId:
    case StackSwitchId:
      *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar1;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
      break;
    case LocalGetId:
      PrecomputingExpressionRunner::visitLocalGet
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(LocalGet *)curr);
      break;
    case LocalSetId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitLocalSet
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (LocalSet *)curr);
      break;
    case GlobalGetId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitGlobalGet
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (GlobalGet *)curr);
      break;
    case GlobalSetId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitGlobalSet
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (GlobalSet *)curr);
      break;
    case ConstId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitConst
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Const *)curr);
      break;
    case UnaryId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitUnary
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Unary *)curr);
      break;
    case BinaryId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBinary
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Binary *)curr);
      break;
    case SelectId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSelect
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Select *)curr);
      break;
    case DropId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitDrop
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Drop *)curr);
      break;
    case ReturnId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitReturn
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Return *)curr);
      break;
    case NopId:
    case AtomicFenceId:
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      break;
    case UnreachableId:
      (**(code **)(*(long *)this + 0x10))(this,"unreachable");
      handle_unreachable("unreachable",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                         ,0x57a);
    case SIMDExtractId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDExtract
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDReplace
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDShuffle
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDTernary
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDShift
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDShift *)curr);
      break;
    case RefNullId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefNull
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefNull *)curr);
      break;
    case RefIsNullId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefIsNull
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefIsNull *)curr);
      break;
    case RefFuncId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefFunc
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefFunc *)curr);
      break;
    case RefEqId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefEq
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefEq *)curr);
      break;
    case ThrowId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitThrow
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Throw *)curr);
      break;
    case ThrowRefId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitThrowRef
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTupleMake
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(TupleMake *)curr);
      break;
    case TupleExtractId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTupleExtract
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(TupleExtract *)curr);
      break;
    case RefI31Id:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefI31
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefI31 *)curr);
      break;
    case I31GetId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitI31Get
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(I31Get *)curr);
      break;
    case RefTestId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefTest
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefTest *)curr);
      break;
    case RefCastId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefCast
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefCast *)curr);
      break;
    case BrOnId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBrOn
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(BrOn *)curr);
      break;
    case StructNewId:
      PrecomputingExpressionRunner::visitStructNew
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(StructNew *)curr);
      break;
    case StructGetId:
      PrecomputingExpressionRunner::visitStructGet
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(StructGet *)curr);
      break;
    case StructRMWId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructRMW
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StructRMW *)curr);
      break;
    case StructCmpxchgId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructCmpxchg
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      PrecomputingExpressionRunner::visitArrayNew
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(ArrayNew *)curr);
      break;
    case ArrayNewFixedId:
      PrecomputingExpressionRunner::visitArrayNewFixed
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      PrecomputingExpressionRunner::visitArrayGet
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(ArrayGet *)curr);
      break;
    case ArrayLenId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayLen
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(ArrayLen *)curr);
      break;
    case RefAsId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefAs
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,(RefAs *)curr)
      ;
      break;
    case StringNewId:
      PrecomputingExpressionRunner::visitStringNew
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(StringNew *)curr);
      break;
    case StringConstId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringConst
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringConst *)curr);
      break;
    case StringMeasureId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringMeasure
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringMeasure *)curr);
      break;
    case StringConcatId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringConcat
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringConcat *)curr);
      break;
    case StringEqId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringEq
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringWTF16Get
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringSliceWTF
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringSliceWTF *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::PrecomputingExpressionRunner, wasm::Flow>::visit(Expression *) [SubType = wasm::PrecomputingExpressionRunner, ReturnType = wasm::Flow]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }